

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client-http.c
# Opt level: O1

int lws_http_basic_auth_gen(char *user,char *pw,char *buf,size_t len)

{
  uint in_len;
  size_t sVar1;
  size_t sVar2;
  int iVar3;
  char b [128];
  char acStack_a8 [128];
  
  sVar1 = strlen(user);
  sVar2 = strlen(pw);
  iVar3 = 1;
  if (((sVar2 + sVar1) * 4 + 4) / 3 + 7 <= len) {
    builtin_strncpy(buf,"Basic ",6);
    in_len = lws_snprintf(acStack_a8,0x80,"%s:%s",user,pw);
    iVar3 = 2;
    if (in_len < 0x7e) {
      lws_b64_encode_string(acStack_a8,in_len,buf + 6,(int)len + -6);
      buf[len - 1] = '\0';
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int
lws_http_basic_auth_gen(const char *user, const char *pw, char *buf, size_t len)
{
	size_t n = strlen(user), m = strlen(pw);
	char b[128];

	if (len < 6 + ((4 * (n + m + 1)) / 3) + 1)
		return 1;

	memcpy(buf, "Basic ", 6);

	n = lws_snprintf(b, sizeof(b), "%s:%s", user, pw);
	if (n >= sizeof(b) - 2)
		return 2;

	lws_b64_encode_string(b, (int)n, buf + 6, (int)len - 6);
	buf[len - 1] = '\0';

	return 0;
}